

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O1

bool __thiscall
ON_Mesh::GetTightBoundingBox
          (ON_Mesh *this,ON_BoundingBox *Xtight_bbox,bool bGrowBox,
          ON_SimpleArray<ON_PlaneEquation> *Clip,ON_Xform *xform)

{
  uint uVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  ON_MeshFace *pOVar2;
  double dVar3;
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dPoint P_02;
  ON_3dPoint P_03;
  ON_3dPoint P_04;
  ON_3dPoint P_05;
  ON_3dPoint P_06;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  uint uVar8;
  ON_Xform *this_00;
  ON_SimpleArray<ON_PlaneEquation> *pOVar9;
  bool bVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  undefined7 extraout_var;
  double *pdVar15;
  double *pdVar16;
  long lVar17;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 in_register_00000011;
  ulong uVar18;
  ulong uVar19;
  ON_BoundingBox *pOVar20;
  byte bVar21;
  int fvi;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  ON_Mesh *pOVar28;
  bool bVar29;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  uint NextData;
  uint LastData;
  ON_3dPoint P;
  ON_Interval Dom;
  ON_3dPoint Next;
  ON_BoundingBox bbox;
  ON_Interval D;
  ON_SHA1_Hash hash;
  vector<bool,_std::allocator<bool>_> ClipData;
  uint local_2d8;
  uint local_2d4;
  ON_MeshFace *local_2d0;
  ON_Mesh *local_2c8;
  ulong local_2c0;
  ON_3dPoint local_2b8;
  ON_Xform *local_298;
  ulong local_290;
  ulong local_288;
  ON_SimpleArray<ON_PlaneEquation> *local_280;
  uint local_274;
  ON_Interval local_270;
  ON_BoundingBox *local_260;
  ON_3dPoint local_258;
  uint local_23c;
  ON_BoundingBox local_238;
  undefined1 local_208 [16];
  ON_BoundingBoxCache *local_1f0;
  ulong local_1e8;
  ON_3dPoint local_1e0;
  long local_1c8;
  ON_3dPoint local_1c0;
  ON_3dPoint local_1a8;
  ON_SHA1_Hash local_18c;
  vector<bool,_std::allocator<bool>_> local_178 [4];
  ON_SHA1 local_b8;
  
  uVar13 = (uint)CONCAT71(in_register_00000011,bGrowBox);
  if (uVar13 != 0) {
    bVar10 = ON_BoundingBox::IsNotEmpty(Xtight_bbox);
    uVar13 = (uint)CONCAT71(extraout_var,bVar10 && bGrowBox);
  }
  dVar7 = ON_BoundingBox::EmptyBoundingBox.m_max.z;
  dVar6 = ON_BoundingBox::EmptyBoundingBox.m_max.x;
  dVar5 = ON_BoundingBox::EmptyBoundingBox.m_min.z;
  dVar4 = ON_BoundingBox::EmptyBoundingBox.m_min.y;
  dVar3 = ON_BoundingBox::EmptyBoundingBox.m_min.x;
  bVar21 = (byte)uVar13;
  if (bVar21 == 0) {
    (Xtight_bbox->m_max).y = ON_BoundingBox::EmptyBoundingBox.m_max.y;
    (Xtight_bbox->m_max).z = dVar7;
    (Xtight_bbox->m_min).z = dVar5;
    (Xtight_bbox->m_max).x = dVar6;
    (Xtight_bbox->m_min).x = dVar3;
    (Xtight_bbox->m_min).y = dVar4;
  }
  if (xform == (ON_Xform *)0x0) {
    local_298 = (ON_Xform *)0x0;
  }
  else {
    bVar10 = ON_Xform::IsIdentity(xform,0.0);
    local_298 = (ON_Xform *)0x0;
    if (!bVar10) {
      local_298 = xform;
    }
  }
  if ((local_298 == (ON_Xform *)0x0) && (Clip->m_count < 1)) {
    pdVar15 = ON_3dPoint::operator_cast_to_double_(&Xtight_bbox->m_min);
    pdVar16 = ON_3dPoint::operator_cast_to_double_(&Xtight_bbox->m_max);
    UNRECOVERED_JUMPTABLE = (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x19];
    iVar12 = (*UNRECOVERED_JUMPTABLE)
                       (this,pdVar15,pdVar16,(ulong)(uVar13 & 0xff),UNRECOVERED_JUMPTABLE);
    return SUB41(iVar12,0);
  }
  local_b8.m_state[2] = 0;
  local_b8.m_state[3] = 0;
  local_b8.m_state[4] = 0;
  local_b8.m_bit_count[0] = 0;
  local_b8.m_bit_count[1] = 0;
  local_b8.m_state[0] = 0;
  local_b8.m_state[1] = 0;
  local_b8.m_buffer[0x30] = '\0';
  local_b8.m_buffer[0x31] = '\0';
  local_b8.m_buffer[0x32] = '\0';
  local_b8.m_buffer[0x33] = '\0';
  local_b8.m_buffer[0x34] = '\0';
  local_b8.m_buffer[0x35] = '\0';
  local_b8.m_buffer[0x36] = '\0';
  local_b8.m_buffer[0x37] = '\0';
  local_b8.m_buffer[0x38] = '\0';
  local_b8.m_buffer[0x39] = '\0';
  local_b8.m_buffer[0x3a] = '\0';
  local_b8.m_buffer[0x3b] = '\0';
  local_b8.m_buffer[0x3c] = '\0';
  local_b8.m_buffer[0x3d] = '\0';
  local_b8.m_buffer[0x3e] = '\0';
  local_b8.m_buffer[0x3f] = '\0';
  local_b8.m_buffer[0x20] = '\0';
  local_b8.m_buffer[0x21] = '\0';
  local_b8.m_buffer[0x22] = '\0';
  local_b8.m_buffer[0x23] = '\0';
  local_b8.m_buffer[0x24] = '\0';
  local_b8.m_buffer[0x25] = '\0';
  local_b8.m_buffer[0x26] = '\0';
  local_b8.m_buffer[0x27] = '\0';
  local_b8.m_buffer[0x28] = '\0';
  local_b8.m_buffer[0x29] = '\0';
  local_b8.m_buffer[0x2a] = '\0';
  local_b8.m_buffer[0x2b] = '\0';
  local_b8.m_buffer[0x2c] = '\0';
  local_b8.m_buffer[0x2d] = '\0';
  local_b8.m_buffer[0x2e] = '\0';
  local_b8.m_buffer[0x2f] = '\0';
  local_b8.m_buffer[0x10] = '\0';
  local_b8.m_buffer[0x11] = '\0';
  local_b8.m_buffer[0x12] = '\0';
  local_b8.m_buffer[0x13] = '\0';
  local_b8.m_buffer[0x14] = '\0';
  local_b8.m_buffer[0x15] = '\0';
  local_b8.m_buffer[0x16] = '\0';
  local_b8.m_buffer[0x17] = '\0';
  local_b8.m_buffer[0x18] = '\0';
  local_b8.m_buffer[0x19] = '\0';
  local_b8.m_buffer[0x1a] = '\0';
  local_b8.m_buffer[0x1b] = '\0';
  local_b8.m_buffer[0x1c] = '\0';
  local_b8.m_buffer[0x1d] = '\0';
  local_b8.m_buffer[0x1e] = '\0';
  local_b8.m_buffer[0x1f] = '\0';
  local_b8.m_buffer[0] = '\0';
  local_b8.m_buffer[1] = '\0';
  local_b8.m_buffer[2] = '\0';
  local_b8.m_buffer[3] = '\0';
  local_b8.m_buffer[4] = '\0';
  local_b8.m_buffer[5] = '\0';
  local_b8.m_buffer[6] = '\0';
  local_b8.m_buffer[7] = '\0';
  local_b8.m_buffer[8] = '\0';
  local_b8.m_buffer[9] = '\0';
  local_b8.m_buffer[10] = '\0';
  local_b8.m_buffer[0xb] = '\0';
  local_b8.m_buffer[0xc] = '\0';
  local_b8.m_buffer[0xd] = '\0';
  local_b8.m_buffer[0xe] = '\0';
  local_b8.m_buffer[0xf] = '\0';
  local_b8.m_byte_count = 0;
  local_b8.m_status_bits = 0;
  local_b8.m_reserved = 0;
  local_2c8 = this;
  ON_SHA1_Hash::ON_SHA1_Hash(&local_b8.m_sha1_hash);
  if (local_298 != (ON_Xform *)0x0) {
    ON_SHA1::AccumulateTransformation(&local_b8,local_298);
  }
  if (Clip->m_count != 0) {
    lVar26 = 0;
    uVar27 = 0;
    do {
      ON_SHA1::AccumulateDoubleArray(&local_b8,4,(double *)((long)&Clip->m_a->x + lVar26));
      uVar27 = uVar27 + 1;
      lVar26 = lVar26 + 0x20;
    } while (uVar27 < (uint)Clip->m_count);
  }
  ON_SHA1::Hash(&local_18c,&local_b8);
  ON_BoundingBox::ON_BoundingBox(&local_238);
  pOVar28 = local_2c8;
  local_1f0 = &local_2c8->m_tight_bbox_cache;
  bVar10 = ON_BoundingBoxCache::GetBoundingBox(local_1f0,&local_18c,&local_238);
  if (bVar10) {
    if (bVar21 == 0) {
      (Xtight_bbox->m_max).y = local_238.m_max.y;
      (Xtight_bbox->m_max).z = local_238.m_max.z;
      (Xtight_bbox->m_min).z = local_238.m_min.z;
      (Xtight_bbox->m_max).x = local_238.m_max.x;
      (Xtight_bbox->m_min).x = local_238.m_min.x;
      (Xtight_bbox->m_min).y = local_238.m_min.y;
    }
    else {
      ON_BoundingBox::Union(Xtight_bbox,&local_238);
    }
    bVar11 = ON_BoundingBox::IsNotEmpty(Xtight_bbox);
  }
  else {
    local_274 = uVar13;
    local_260 = Xtight_bbox;
    if (local_298 == (ON_Xform *)0x0) {
      bVar10 = ON_BoundingBox::IsNotEmpty(&pOVar28->m_vertex_bbox);
      if (bVar10) {
        ON_BoundingBox::GetCorners(&pOVar28->m_vertex_bbox,(ON_3dPoint *)local_178);
        bVar10 = true;
        uVar27 = 0;
        do {
          if ((bVar10) && (0 < Clip->m_count)) {
            lVar26 = uVar27 * 0x18;
            lVar24 = 0;
            lVar17 = 1;
            do {
              P_00.y = (double)*(undefined8 *)
                                ((long)&local_178[0].super__Bvector_base<std::allocator<bool>_>.
                                        _M_impl.super__Bvector_impl_data._M_start + lVar26 + 8);
              P_00.x = (double)*(undefined8 *)
                                ((long)&local_178[0].super__Bvector_base<std::allocator<bool>_>.
                                        _M_impl.super__Bvector_impl_data._M_start + lVar26);
              P_00.z = *(double *)
                        ((long)&local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish + lVar26);
              dVar3 = ON_PlaneEquation::ValueAt
                                ((ON_PlaneEquation *)((long)&Clip->m_a->x + lVar24),P_00);
              if (0.0 < dVar3) break;
              lVar24 = lVar24 + 0x20;
              bVar10 = lVar17 < Clip->m_count;
              lVar17 = lVar17 + 1;
            } while (bVar10);
            bVar10 = dVar3 <= 0.0;
          }
          uVar22 = uVar27;
        } while ((bVar10) && (uVar22 = uVar27 + 1, bVar29 = uVar27 < 7, uVar27 = uVar22, bVar29));
        bVar11 = (byte)uVar22;
        if (bVar10) {
          pdVar15 = ON_3dPoint::operator_cast_to_double_(&local_238.m_min);
          pdVar16 = ON_3dPoint::operator_cast_to_double_(&local_238.m_max);
          iVar12 = (*(local_2c8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x19])
                             (local_2c8,pdVar15,pdVar16,0);
          ON_BoundingBoxCache::AddBoundingBox(local_1f0,&local_238,&local_18c);
          pOVar20 = local_260;
          if (((byte)iVar12 & bVar21) == 1) {
            ON_BoundingBox::Union(local_260,&local_238);
          }
          else {
            (local_260->m_max).y = local_238.m_max.y;
            (local_260->m_max).z = local_238.m_max.z;
            (local_260->m_min).z = local_238.m_min.z;
            (local_260->m_max).x = local_238.m_max.x;
            (local_260->m_min).x = local_238.m_min.x;
            (local_260->m_min).y = local_238.m_min.y;
          }
          bVar11 = ON_BoundingBox::IsNotEmpty(pOVar20);
        }
        pOVar28 = local_2c8;
        if (bVar10) goto LAB_003d4285;
      }
    }
    uVar13 = VertexCount(pOVar28);
    if ((int)uVar13 < 3) {
      bVar11 = 0;
    }
    else {
      uVar1 = Clip->m_count;
      uVar27 = 0x20;
      if ((int)uVar1 < 0x20) {
        uVar27 = (ulong)uVar1;
      }
      iVar12 = 1;
      if (0 < (int)uVar1) {
        dVar3 = log2((double)(int)((uint)(1 < (int)uVar1) + (int)uVar27));
        dVar3 = ceil(dVar3);
        iVar12 = 1 << ((byte)(int)dVar3 & 0x1f);
      }
      local_2b8.x = (double)((ulong)local_2b8.x & 0xffffffffffffff00);
      std::vector<bool,_std::allocator<bool>_>::vector
                (local_178,(long)(int)(iVar12 * uVar13),(bool *)&local_2b8,
                 (allocator_type *)&local_258);
      local_2d0 = (ON_MeshFace *)(long)iVar12;
      if ((int)uVar13 < 2) {
        uVar13 = 1;
      }
      local_2c0 = (ulong)uVar13;
      local_208._0_8_ = uVar27 << 5;
      iVar25 = 2;
      uVar22 = 0;
      local_288 = 0x800000000000003f;
      local_290 = uVar27;
      local_280 = Clip;
      local_1e8 = uVar27;
      do {
        ON_3dPoint::ON_3dPoint
                  (&local_2b8,(pOVar28->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + uVar22);
        if (local_298 != (ON_Xform *)0x0) {
          ON_Xform::operator*(&local_258,local_298,&local_2b8);
          local_2b8.z = local_258.z;
          local_2b8.x = local_258.x;
          local_2b8.y = local_258.y;
        }
        if ((int)uVar1 < 1) {
LAB_003d3b70:
          ON_BoundingBox::Set(&local_238,&local_2b8,1);
        }
        else {
          P_01.y = local_2b8.y;
          P_01.x = local_2b8.x;
          P_01.z = local_2b8.z;
          dVar3 = ON_PlaneEquation::ValueAt(Clip->m_a,P_01);
          uVar27 = uVar22 * (long)local_2d0;
          bVar10 = 0.0 < dVar3;
          if (1 < (int)uVar1) {
            uVar18 = uVar27 + 1;
            uVar19 = uVar27 + 0x40;
            if (-1 < (long)uVar18) {
              uVar19 = uVar18;
            }
            lVar26 = (long)uVar19 >> 6;
            uVar19 = (ulong)((uVar18 & local_288) < 0x8000000000000001);
            uVar18 = 1L << ((byte)uVar18 & 0x3f);
            if (dVar3 <= 0.0) {
              uVar18 = ~uVar18 & local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                 [lVar26 + (uVar19 - 1)];
            }
            else {
              uVar18 = uVar18 | local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                [lVar26 + (uVar19 - 1)];
            }
            local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
            ._M_start.super__Bit_iterator_base._M_p[lVar26 + (uVar19 - 1)] = uVar18;
            if (1 < (int)uVar1) {
              uVar18 = (ulong)iVar25;
              lVar26 = 0x20;
              do {
                P_02.y = local_2b8.y;
                P_02.x = local_2b8.x;
                P_02.z = local_2b8.z;
                dVar3 = ON_PlaneEquation::ValueAt
                                  ((ON_PlaneEquation *)((long)&local_280->m_a->x + lVar26),P_02);
                uVar19 = uVar18 + 0x3f;
                if (-1 < (long)uVar18) {
                  uVar19 = uVar18;
                }
                lVar17 = (long)uVar19 >> 6;
                uVar23 = (ulong)((uVar18 & local_288) < 0x8000000000000001);
                uVar19 = 1L << ((byte)uVar18 & 0x3f);
                if (dVar3 <= 0.0) {
                  uVar19 = ~uVar19 & local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl
                                     .super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                     _M_p[lVar17 + (uVar23 - 1)];
                }
                else {
                  uVar19 = uVar19 | local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                    [lVar17 + (uVar23 - 1)];
                }
                local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [lVar17 + (uVar23 - 1)] = uVar19;
                bVar10 = (bool)(bVar10 | 0.0 < dVar3);
                lVar26 = lVar26 + 0x20;
                uVar18 = uVar18 + 1;
              } while (local_208._0_8_ != lVar26);
            }
          }
          uVar18 = uVar27 + 0x3f;
          if (-1 < (long)uVar27) {
            uVar18 = uVar27;
          }
          lVar26 = (long)uVar18 >> 6;
          uVar18 = (ulong)((uVar27 & local_288) < 0x8000000000000001);
          uVar27 = 1L << ((byte)uVar27 & 0x3f);
          if (bVar10) {
            uVar27 = uVar27 | local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                              [lVar26 + (uVar18 - 1)];
          }
          else {
            uVar27 = ~uVar27 & local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                               [lVar26 + (uVar18 - 1)];
          }
          local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[lVar26 + (uVar18 - 1)] = uVar27;
          Clip = local_280;
          pOVar28 = local_2c8;
          if (!bVar10) goto LAB_003d3b70;
        }
        uVar22 = uVar22 + 1;
        iVar25 = iVar25 + iVar12;
      } while (uVar22 != local_2c0);
      pOVar20 = local_260;
      uVar13 = local_274;
      if (0 < (int)uVar1) {
        local_23c = (int)local_290 - 1;
        local_1e8 = local_1e8 << 5;
        lVar26 = 0;
        while (pOVar20 = local_260, uVar13 = local_274, iVar25 = FaceCount(pOVar28), lVar26 < iVar25
              ) {
          pOVar2 = (pOVar28->m_F).m_a;
          local_2d4 = 0;
          iVar25 = pOVar2[lVar26].vi[0];
          iVar14 = iVar25 * iVar12;
          uVar22 = (ulong)iVar14;
          uVar27 = uVar22 + 0x3f;
          if (-1 < (long)uVar22) {
            uVar27 = uVar22;
          }
          bVar10 = (local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                    [((long)uVar27 >> 6) + ((ulong)((uVar22 & local_288) < 0x8000000000000001) - 1)]
                   & 1L << ((byte)iVar14 & 0x3f)) != 0;
          local_1c8 = lVar26;
          if (bVar10) {
            GetClipData(iVar25,local_178,&local_2d4,(int)local_290,iVar12);
          }
          uVar27 = (ulong)bVar10;
          local_2d0 = pOVar2 + lVar26;
          lVar26 = 0;
          do {
            if ((lVar26 != 2) || (local_2d0->vi[2] != local_2d0->vi[3])) {
              local_2d8 = 0;
              uVar13 = (int)lVar26 + 1U & 3;
              iVar25 = local_2d0->vi[uVar13] * iVar12;
              uVar18 = (ulong)iVar25;
              uVar22 = uVar18 + 0x3f;
              if (-1 < (long)uVar18) {
                uVar22 = uVar18;
              }
              uVar22 = 1L << ((byte)iVar25 & 0x3f) &
                       local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar22 >> 6) +
                        ((ulong)((uVar18 & local_288) < 0x8000000000000001) - 1)];
              if (uVar22 == 0) {
                local_2c0 = local_2c0 & 0xffffffff00000000;
              }
              else {
                GetClipData(local_2d0->vi[uVar13],local_178,&local_2d8,(int)local_290,iVar12);
                local_2c0 = CONCAT44(local_2c0._4_4_,(int)CONCAT71(extraout_var_00,1));
              }
              if (uVar22 != 0 || bVar10) {
                if ((uVar27 & 1) == 0) {
                  GetClipData(local_2d0->vi[lVar26],local_178,&local_2d4,(int)local_290,iVar12);
                }
                if ((char)local_2c0 == '\0') {
                  GetClipData(local_2d0->vi[lVar26],local_178,&local_2d8,(int)local_290,iVar12);
                  local_2c0 = CONCAT44(local_2c0._4_4_,(int)CONCAT71(extraout_var_01,1));
                }
              }
              pOVar28 = local_2c8;
              pOVar2 = local_2d0;
              uVar8 = local_2d4;
              uVar1 = local_2d8;
              if ((uVar22 != 0 || bVar10) && ((local_2d8 & local_2d4) == 0)) {
                ON_3dPoint::ON_3dPoint
                          (&local_2b8,
                           (local_2c8->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a +
                           local_2d0->vi[lVar26]);
                ON_3dPoint::ON_3dPoint
                          (&local_258,
                           (pOVar28->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + pOVar2->vi[uVar13])
                ;
                this_00 = local_298;
                if (local_298 != (ON_Xform *)0x0) {
                  ON_Xform::operator*(&local_1e0,local_298,&local_2b8);
                  local_2b8.z = local_1e0.z;
                  local_2b8.x = local_1e0.x;
                  local_2b8.y = local_1e0.y;
                  ON_Xform::operator*(&local_1e0,this_00,&local_258);
                  local_258.z = local_1e0.z;
                  local_258.x = local_1e0.x;
                  local_258.y = local_1e0.y;
                }
                ON_Interval::ON_Interval(&local_270,0.0,1.0);
                uVar27 = 0;
                uVar13 = local_23c;
                do {
                  bVar10 = ON_Interval::operator!=(&local_270,&ON_Interval::EmptyInterval);
                  pOVar9 = local_280;
                  if (!bVar10) break;
                  if ((uVar8 >> (uVar13 & 0x1f) & 1) == 0) {
                    if ((1 << ((byte)uVar13 & 0x1f) & uVar1) != 0) {
                      P_05.y = local_2b8.y;
                      P_05.x = local_2b8.x;
                      P_05.z = local_2b8.z;
                      dVar3 = ON_PlaneEquation::ValueAt
                                        ((ON_PlaneEquation *)((long)&local_280->m_a->x + uVar27),
                                         P_05);
                      local_208._8_4_ = extraout_XMM0_Dc;
                      local_208._0_8_ = dVar3;
                      local_208._12_4_ = extraout_XMM0_Dd;
                      P_06.y = local_258.y;
                      P_06.x = local_258.x;
                      P_06.z = local_258.z;
                      dVar3 = ON_PlaneEquation::ValueAt
                                        ((ON_PlaneEquation *)((long)&pOVar9->m_a->x + uVar27),P_06);
                      ON_Interval::ON_Interval
                                ((ON_Interval *)&local_1e0,0.0,
                                 -(double)local_208._0_8_ / (dVar3 - (double)local_208._0_8_));
                      ON_Interval::Intersection(&local_270,(ON_Interval *)&local_1e0);
                    }
                  }
                  else {
                    P_03.y = local_2b8.y;
                    P_03.x = local_2b8.x;
                    P_03.z = local_2b8.z;
                    dVar3 = ON_PlaneEquation::ValueAt
                                      ((ON_PlaneEquation *)((long)&local_280->m_a->x + uVar27),P_03)
                    ;
                    local_208._0_8_ = dVar3;
                    P_04.y = local_258.y;
                    P_04.x = local_258.x;
                    P_04.z = local_258.z;
                    dVar3 = ON_PlaneEquation::ValueAt
                                      ((ON_PlaneEquation *)((long)&pOVar9->m_a->x + uVar27),P_04);
                    ON_Interval::ON_Interval
                              ((ON_Interval *)&local_1e0,
                               (double)local_208._0_8_ / ((double)local_208._0_8_ - dVar3),1.0);
                    ON_Interval::Intersection(&local_270,(ON_Interval *)&local_1e0);
                  }
                  uVar13 = uVar13 - 1;
                  uVar27 = uVar27 + 0x20;
                } while (local_1e8 != uVar27);
                bVar10 = ON_Interval::operator!=(&local_270,&ON_Interval::EmptyInterval);
                if (bVar10) {
                  pdVar15 = ON_Interval::operator[](&local_270,0);
                  if (0.0 < *pdVar15) {
                    pdVar15 = ON_Interval::operator[](&local_270,0);
                    ::operator*(&local_1a8,1.0 - *pdVar15,&local_2b8);
                    pdVar15 = ON_Interval::operator[](&local_270,0);
                    ::operator*(&local_1c0,*pdVar15,&local_258);
                    ON_3dPoint::operator+(&local_1e0,&local_1a8,&local_1c0);
                    ON_BoundingBox::Set(&local_238,&local_1e0,1);
                  }
                  pdVar15 = ON_Interval::operator[](&local_270,1);
                  if (*pdVar15 <= 1.0 && *pdVar15 != 1.0) {
                    pdVar15 = ON_Interval::operator[](&local_270,1);
                    ::operator*(&local_1a8,1.0 - *pdVar15,&local_2b8);
                    pdVar15 = ON_Interval::operator[](&local_270,1);
                    ::operator*(&local_1c0,*pdVar15,&local_258);
                    ON_3dPoint::operator+(&local_1e0,&local_1a8,&local_1c0);
                    ON_BoundingBox::Set(&local_238,&local_1e0,1);
                  }
                }
              }
              local_2d4 = local_2d8;
              uVar27 = local_2c0 & 0xffffffff;
              bVar10 = uVar22 != 0;
            }
            lVar26 = lVar26 + 1;
          } while (lVar26 != 4);
          pOVar28 = local_2c8;
          lVar26 = local_1c8 + 1;
        }
      }
      ON_BoundingBoxCache::AddBoundingBox(local_1f0,&local_238,&local_18c);
      bVar10 = ON_BoundingBox::IsNotEmpty(&local_238);
      if (bVar10) {
        if ((char)uVar13 == '\0') {
          (pOVar20->m_max).y = local_238.m_max.y;
          (pOVar20->m_max).z = local_238.m_max.z;
          (pOVar20->m_min).z = local_238.m_min.z;
          (pOVar20->m_max).x = local_238.m_max.x;
          (pOVar20->m_min).x = local_238.m_min.x;
          (pOVar20->m_min).y = local_238.m_min.y;
        }
        else {
          ON_BoundingBox::Union(pOVar20,&local_238);
        }
      }
      bVar11 = ON_BoundingBox::IsNotEmpty(pOVar20);
      if (local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
    }
  }
LAB_003d4285:
  return (bool)(bVar11 & 1);
}

Assistant:

bool ON_Mesh::GetTightBoundingBox(
	ON_BoundingBox& Xtight_bbox,
	bool bGrowBox,
	const ON_SimpleArray<ON_PlaneEquation>& Clip,
	const ON_Xform* xform
) const
{
	if (bGrowBox && false == Xtight_bbox.IsNotEmpty() )
		bGrowBox = false;

	if (!bGrowBox)
		Xtight_bbox = ON_BoundingBox::EmptyBoundingBox;

	// Avoid applying the identity transformation repeatedly
	if (xform && xform->IsIdentity())
		xform = nullptr;

  if (Clip.Count() <= 0 && xform == nullptr)
    return (GetBBox(Xtight_bbox.m_min, Xtight_bbox.m_max, bGrowBox) ? true : false);

  // Dale Lear
  // Set hash = sha1 hash of information needed to get the tight bounding box.
  // This does not include a hash of mesh vertex locations. These cached
  // boxes are removed by ON_Mesh.InvalidateBoundingBoxes() so this hash
  // does not need to include vertex locations or face information.
  ON_SHA1 sha1;
  if (nullptr != xform)
    sha1.AccumulateTransformation(*xform);
  for (unsigned int i = 0; i < Clip.UnsignedCount(); i++)
  {
    sha1.AccumulateDoubleArray(4, &Clip[i].x);
  }
  const ON_SHA1_Hash hash = sha1.Hash();

  ON_BoundingBox bbox;

  if (m_tight_bbox_cache.GetBoundingBox(hash, bbox))
  {
    if (bGrowBox)
      Xtight_bbox.Union(bbox);
    else
      Xtight_bbox = bbox;
    return Xtight_bbox.IsNotEmpty();
  }

	// Perform clip test on cached bbox 
	if (xform == nullptr && m_vertex_bbox.IsNotEmpty())
	{
		ON_3dPoint Corner[8];
		m_vertex_bbox.GetCorners(Corner);

		bool AllIn = true;
		for( int i=0; AllIn && i<8; i++)
			for (int j = 0; AllIn && j < Clip.Count(); j++)
			{
				AllIn = (Clip[j].ValueAt(Corner[i]) <= 0.0);
			}

    if (AllIn)
    {
      bool rc = GetBBox(bbox.m_min, bbox.m_max, false) ? true : false;
      m_tight_bbox_cache.AddBoundingBox(bbox, hash);
      if (rc && bGrowBox)
        Xtight_bbox.Union(bbox);
      else
        Xtight_bbox = bbox;
      return Xtight_bbox.IsNotEmpty();
    }
	}

	// Now just add verticies of the clipped mesh
	int vcnt = VertexCount();

  // 16 Sept 2021, Mikko, RH-49510:
  // Bail out if the mesh is bogus. In the associated youtrack item
  // this fixes the bounding box of a block being way too big.
  if (vcnt < 3)
    return false;
	
	// n = number of clipping planes.  At most 32 clipping planes are allowed so that this function can use unsigned int
	// to represent the 32 clip predicates.
	int n = Clip.Count();
	if (n > 32)
		n = 32;
	int bits = (n > 1) ? n + 1 : n;
	int bpv = (n>0)?1<<int(ceil(log2(bits))) : 1;		// bits per vertex this is a power of 2
	std::vector<bool> ClipData(vcnt*bpv, false);  // ClipData[ vi*bpv ] is true if vertex vi is clipped out of the view
                                         // If n>1 then further information is provided by
																				//    ClipData[vi*bpv + j+ 1] is true if Clip[j](m_V[vi])>0 that is
																				//           vertex vi is clipped out by Clip[j]
	// Compute ClipData for each vertex
	for (int vi = 0; vi < vcnt; vi++)
	{
		ON_3dPoint P = m_V[vi];
		if (xform)
			P = (*xform)*P;

		bool clipped = false;
		if (n > 0)
		{
			int cdi0 = vi*bpv;
			clipped = Clip[0].ValueAt(P) > 0;

			if (n > 1)
			{
				int cdi1 = cdi0 + 1;
				ClipData[cdi1++] = clipped;
				for (int j = 1; j < n; j++)
				{
					bool out = Clip[j].ValueAt(P) > 0;
					ClipData[cdi1++] = out;
					clipped = clipped || out;
				}
			}
			ClipData[cdi0] = clipped;
		}
		// If the vertex is not clipped add it to the boundingbox
		if( !clipped)
			bbox.Set(P, true);
	}

	if (n > 0)
	{
		// Now process each mesh face and look for intersections with the clipping region boundary
		for (int fi = 0; fi < FaceCount(); fi++)
		{
			const ON_MeshFace& F = m_F[fi];
			unsigned int LastData=0;
			bool LastDataValid = false;
			bool LastOut = ClipData[F.vi[0] * bpv];
			if (LastOut)
			{
				GetClipData(F.vi[0], ClipData, &LastData, n, bpv);
				LastDataValid = true;
			}
			for (int fvi = 0; fvi < 4; fvi++)
			{
				if (fvi == 2 && F.vi[fvi] == F.vi[fvi + 1])
					continue;

				unsigned int NextData=0;
				bool NextDataValid=false;
				bool NextOut = ClipData[F.vi[(fvi + 1) % 4] * bpv];
				if (NextOut)
				{
					GetClipData(F.vi[(fvi + 1) % 4], ClipData, &NextData, n, bpv);
					NextDataValid = true;
				}

				if (LastOut || NextOut)
				{
					// Make sure *Data is Valid
					if (!LastDataValid)
					{
						GetClipData(F.vi[fvi], ClipData, &LastData, n, bpv);
						LastDataValid = true;
					}
					if (!NextDataValid)
					{
						GetClipData(F.vi[fvi], ClipData, &NextData, n, bpv);
						NextDataValid = true;
					}
				}
				if ((LastOut || NextOut) && (LastData & NextData) == 0)
				{
					// Is there a segment of this edge that is not clipped out
					ON_3dPoint Last = m_V[F.vi[fvi]];
					ON_3dPoint Next = m_V[F.vi[(fvi + 1) % 4]];
					if (xform)
					{
						Last = (*xform)*Last;
						Next = (*xform)*Next;
					}

					ON_Interval Dom(0.0, 1.0);  // Dom parameterizes the line segment from Last to Next
					for (int j = 0; j < n && Dom != ON_Interval::EmptyInterval; j++)
					{
						unsigned int mask = 1 << (n - 1 - j);
						if (mask & LastData)
						{
							double cplast = Clip[j].ValueAt(Last);		// out >0
							double cpnext = Clip[j].ValueAt(Next);		// in <0 
							ON_Interval D(cplast / (cplast - cpnext), 1.0);
							Dom.Intersection(D);
						}
						else if (mask & NextData)
						{
							double cplast = Clip[j].ValueAt(Last);
							double cpnext = Clip[j].ValueAt(Next);
							ON_Interval D(0.0, -cplast / (cpnext - cplast));
							Dom.Intersection(D);
						}
					}
					if (Dom != ON_Interval::EmptyInterval)
					{
						if (Dom[0] > 0.0)
						{
							ON_3dPoint Pt = (1 - Dom[0])*Last + Dom[0] * Next;
							bbox.Set(Pt, true);
						}
						if (Dom[1] < 1.0)
						{
							ON_3dPoint Pt = (1 - Dom[1])*Last + Dom[1] * Next;
							bbox.Set(Pt, true);
						}
					}
				}

				LastOut = NextOut;
				LastDataValid = NextDataValid;
				LastData = NextData;
			}
		}
	}

  m_tight_bbox_cache.AddBoundingBox(bbox, hash);
  if (bbox.IsNotEmpty())
  {
    if (bGrowBox)
      Xtight_bbox.Union(bbox);
    else
      Xtight_bbox = bbox;
  }

  return Xtight_bbox.IsNotEmpty();
}